

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void __thiscall QGuiApplicationPrivate::notifyLayoutDirectionChange(QGuiApplicationPrivate *this)

{
  int i;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QArrayDataPointer<QWindow_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  for (puVar1 = (undefined1 *)0x0; puVar1 < (ulong)local_38.size; puVar1 = puVar1 + 1) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,ApplicationLayoutDirectionChange);
    QCoreApplication::sendEvent((QObject *)local_38.ptr[(long)puVar1],(QEvent *)&local_48);
    QEvent::~QEvent((QEvent *)&local_48);
  }
  QArrayDataPointer<QWindow_*>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::notifyLayoutDirectionChange()
{
    const QWindowList list = QGuiApplication::topLevelWindows();
    for (int i = 0; i < list.size(); ++i) {
        QEvent ev(QEvent::ApplicationLayoutDirectionChange);
        QCoreApplication::sendEvent(list.at(i), &ev);
    }
}